

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O1

int lws_protocol_init_vhost(lws_vhost *vh,int *any)

{
  void *ptr;
  int iVar1;
  lws_protocol_vhost_options *plVar2;
  lws_log_cx_t *plVar3;
  long lVar4;
  lws _lws;
  char *pcVar5;
  lws local_4c8;
  
  memset(&local_4c8,0,0x498);
  local_4c8.a.context = vh->context;
  if (0 < vh->count_protocols) {
    lVar4 = 0;
    local_4c8.a.vhost = vh;
    do {
      local_4c8.a.protocol = vh->protocols + lVar4;
      pcVar5 = vh->protocols[lVar4].name;
      plVar2 = (lws_protocol_vhost_options *)&vh->pvo;
      if (pcVar5 != (char *)0x0) {
        do {
          plVar2 = plVar2->next;
          if (plVar2 == (lws_protocol_vhost_options *)0x0) {
            plVar2 = (lws_protocol_vhost_options *)0x0;
            break;
          }
          iVar1 = strcmp(plVar2->name,pcVar5);
        } while (iVar1 != 0);
        if (plVar2 == (lws_protocol_vhost_options *)0x0) {
          if (vh == (lws_vhost *)0x0) {
            plVar3 = (lws_log_cx_t *)0x0;
          }
          else {
            plVar3 = (vh->lc).log_cx;
          }
          _lws_log_cx(plVar3,lws_log_prepend_vhost,vh,0x10,"lws_protocol_init_vhost",
                      "not instantiating %s",pcVar5);
        }
        else {
          for (plVar2 = plVar2->options; plVar2 != (lws_protocol_vhost_options *)0x0;
              plVar2 = plVar2->next) {
            if (vh == (lws_vhost *)0x0) {
              plVar3 = (lws_log_cx_t *)0x0;
            }
            else {
              plVar3 = (vh->lc).log_cx;
            }
            pcVar5 = plVar2->name;
            _lws_log_cx(plVar3,lws_log_prepend_vhost,vh,0x10,"lws_protocol_init_vhost",
                        "protocol \"%s\", option \"%s\"",vh->protocols[lVar4].name,pcVar5);
            iVar1 = strcmp(plVar2->name,"default");
            if (iVar1 == 0) {
              if (vh == (lws_vhost *)0x0) {
                plVar3 = (lws_log_cx_t *)0x0;
              }
              else {
                plVar3 = (vh->lc).log_cx;
              }
              _lws_log_cx(plVar3,lws_log_prepend_vhost,vh,8,"lws_protocol_init_vhost",
                          "Setting default protocol to %s",vh->protocols[lVar4].name,pcVar5);
              vh->default_protocol_index = (uchar)lVar4;
            }
            iVar1 = strcmp(plVar2->name,"raw");
            if (iVar1 == 0) {
              if (vh == (lws_vhost *)0x0) {
                plVar3 = (lws_log_cx_t *)0x0;
              }
              else {
                plVar3 = (vh->lc).log_cx;
              }
              _lws_log_cx(plVar3,lws_log_prepend_vhost,vh,8,"lws_protocol_init_vhost",
                          "Setting raw protocol to %s",vh->protocols[lVar4].name,pcVar5);
              vh->raw_protocol_index = (uchar)lVar4;
            }
          }
        }
        if (any != (int *)0x0) {
          *any = *any | (uint)((vh->tls).ssl_ctx != (lws_tls_ctx *)0x0);
        }
        pcVar5 = vh->protocols[lVar4].name;
        plVar2 = (lws_protocol_vhost_options *)&vh->pvo;
        if (pcVar5 == (char *)0x0) {
LAB_00114794:
          plVar2 = (lws_protocol_vhost_options *)0x0;
        }
        else {
          do {
            plVar2 = plVar2->next;
            if (plVar2 == (lws_protocol_vhost_options *)0x0) goto LAB_00114794;
            iVar1 = strcmp(plVar2->name,pcVar5);
          } while (iVar1 != 0);
        }
        if ((plVar2 != (lws_protocol_vhost_options *)0x0) ||
           (vh->pvo == (lws_protocol_vhost_options *)0x0)) {
          if (vh == (lws_vhost *)0x0) {
            plVar3 = (lws_log_cx_t *)0x0;
          }
          else {
            plVar3 = (vh->lc).log_cx;
          }
          _lws_log_cx(plVar3,lws_log_prepend_vhost,vh,8,"lws_protocol_init_vhost","init %s.%s",
                      vh->name,pcVar5);
          if (plVar2 == (lws_protocol_vhost_options *)0x0) {
            plVar2 = (lws_protocol_vhost_options *)0x0;
          }
          else {
            plVar2 = plVar2->options;
          }
          iVar1 = (*vh->protocols[lVar4].callback)
                            (&local_4c8,LWS_CALLBACK_PROTOCOL_INIT,(void *)0x0,plVar2,0);
          if (iVar1 != 0) {
            if ((vh->protocol_vh_privs != (void **)0x0) &&
               (ptr = vh->protocol_vh_privs[lVar4], ptr != (void *)0x0)) {
              lws_realloc(ptr,0,"lws_free");
              vh->protocol_vh_privs[lVar4] = (void *)0x0;
            }
            if (vh == (lws_vhost *)0x0) {
              plVar3 = (lws_log_cx_t *)0x0;
            }
            else {
              plVar3 = (vh->lc).log_cx;
            }
            _lws_log_cx(plVar3,lws_log_prepend_vhost,vh,1,"lws_protocol_init_vhost",
                        "protocol %s failed init",vh->protocols[lVar4].name,pcVar5);
            return 1;
          }
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < vh->count_protocols);
  }
  vh->field_0x368 = vh->field_0x368 | 2;
  return 0;
}

Assistant:

int
lws_protocol_init_vhost(struct lws_vhost *vh, int *any)
{
	const struct lws_protocol_vhost_options *pvo, *pvo1;
	int n;
#if defined(LWS_PLAT_FREERTOS)
	struct lws_a _lwsa, *lwsa = &_lwsa;

	memset(&_lwsa, 0, sizeof(_lwsa));
#else
	struct lws _lws;
	struct lws_a *lwsa = &_lws.a;

	memset(&_lws, 0, sizeof(_lws));
#endif

	lwsa->context = vh->context;
	lwsa->vhost = vh;

	/* initialize supported protocols on this vhost */

	for (n = 0; n < vh->count_protocols; n++) {
		lwsa->protocol = &vh->protocols[n];
		if (!vh->protocols[n].name)
			continue;
		pvo = lws_vhost_protocol_options(vh, vh->protocols[n].name);
		if (pvo) {
			/*
			 * linked list of options specific to
			 * vh + protocol
			 */
			pvo1 = pvo;
			pvo = pvo1->options;

			while (pvo) {
				lwsl_vhost_debug(vh, "protocol \"%s\", "
						     "option \"%s\"",
						     vh->protocols[n].name,
						     pvo->name);

				if (!strcmp(pvo->name, "default")) {
					lwsl_vhost_info(vh, "Setting default "
							     "protocol to %s",
							     vh->protocols[n].name);
					vh->default_protocol_index = (unsigned char)n;
				}
				if (!strcmp(pvo->name, "raw")) {
					lwsl_vhost_info(vh, "Setting raw "
							     "protocol to %s",
							     vh->protocols[n].name);
					vh->raw_protocol_index = (unsigned char)n;
				}
				pvo = pvo->next;
			}
		} else
			lwsl_vhost_debug(vh, "not instantiating %s",
					     vh->protocols[n].name);

#if defined(LWS_WITH_TLS)
		if (any)
			*any |= !!vh->tls.ssl_ctx;
#endif

		pvo = lws_vhost_protocol_options(vh, vh->protocols[n].name);

		/*
		 * inform all the protocols that they are doing their
		 * one-time initialization if they want to.
		 *
		 * NOTE the fakewsi is garbage, except the key pointers that are
		 * prepared in case the protocol handler wants to touch them
		 */

		if (pvo
#if !defined(LWS_WITH_PLUGINS)
				/*
				 * with plugins, you have to explicitly
				 * instantiate them per-vhost with pvos.
				 *
				 * Without plugins, not setting the vhost pvo
				 * list at creation enables all the protocols
				 * by default, for backwards compatibility
				 */
				|| !vh->pvo
#endif
		) {
			lwsl_vhost_info(vh, "init %s.%s", vh->name,
					vh->protocols[n].name);
			if (vh->protocols[n].callback((struct lws *)lwsa,
				LWS_CALLBACK_PROTOCOL_INIT, NULL,
#if !defined(LWS_WITH_PLUGINS)
				(void *)(pvo ? pvo->options : NULL),
#else
				(void *)pvo->options,
#endif
				0)) {
				if (vh->protocol_vh_privs && vh->protocol_vh_privs[n]) {
					lws_free(vh->protocol_vh_privs[n]);
					vh->protocol_vh_privs[n] = NULL;
				}
			lwsl_vhost_err(vh, "protocol %s failed init",
					vh->protocols[n].name);

				return 1;
			}
		}
	}

	vh->created_vhost_protocols = 1;

	return 0;
}